

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AllSyntax.cpp
# Opt level: O0

TokenOrSyntax * __thiscall
slang::syntax::ForeachLoopListSyntax::getChild
          (TokenOrSyntax *__return_storage_ptr__,ForeachLoopListSyntax *this,size_t index)

{
  Token token;
  Token token_00;
  Token token_01;
  Token token_02;
  SyntaxNode *node;
  SyntaxNode *local_80;
  size_t index_local;
  ForeachLoopListSyntax *this_local;
  
  switch(index) {
  case 0:
    token.kind = (this->openParen).kind;
    token._2_1_ = (this->openParen).field_0x2;
    token.numFlags.raw = (this->openParen).numFlags.raw;
    token.rawLen = (this->openParen).rawLen;
    token.info = (this->openParen).info;
    TokenOrSyntax::TokenOrSyntax(__return_storage_ptr__,token);
    break;
  case 1:
    node = (SyntaxNode *)not_null<slang::syntax::NameSyntax_*>::get(&this->arrayName);
    TokenOrSyntax::TokenOrSyntax(__return_storage_ptr__,node);
    break;
  case 2:
    token_00.kind = (this->openBracket).kind;
    token_00._2_1_ = (this->openBracket).field_0x2;
    token_00.numFlags.raw = (this->openBracket).numFlags.raw;
    token_00.rawLen = (this->openBracket).rawLen;
    token_00.info = (this->openBracket).info;
    TokenOrSyntax::TokenOrSyntax(__return_storage_ptr__,token_00);
    break;
  case 3:
    local_80 = (SyntaxNode *)0x0;
    if (this != (ForeachLoopListSyntax *)0xffffffffffffffc8) {
      local_80 = &(this->loopVariables).super_SyntaxListBase.super_SyntaxNode;
    }
    TokenOrSyntax::TokenOrSyntax(__return_storage_ptr__,local_80);
    break;
  case 4:
    token_01.kind = (this->closeBracket).kind;
    token_01._2_1_ = (this->closeBracket).field_0x2;
    token_01.numFlags.raw = (this->closeBracket).numFlags.raw;
    token_01.rawLen = (this->closeBracket).rawLen;
    token_01.info = (this->closeBracket).info;
    TokenOrSyntax::TokenOrSyntax(__return_storage_ptr__,token_01);
    break;
  case 5:
    token_02.kind = (this->closeParen).kind;
    token_02._2_1_ = (this->closeParen).field_0x2;
    token_02.numFlags.raw = (this->closeParen).numFlags.raw;
    token_02.rawLen = (this->closeParen).rawLen;
    token_02.info = (this->closeParen).info;
    TokenOrSyntax::TokenOrSyntax(__return_storage_ptr__,token_02);
    break;
  default:
    TokenOrSyntax::TokenOrSyntax(__return_storage_ptr__,(nullptr_t)0x0);
  }
  return __return_storage_ptr__;
}

Assistant:

TokenOrSyntax ForeachLoopListSyntax::getChild(size_t index) {
    switch (index) {
        case 0: return openParen;
        case 1: return arrayName.get();
        case 2: return openBracket;
        case 3: return &loopVariables;
        case 4: return closeBracket;
        case 5: return closeParen;
        default: return nullptr;
    }
}